

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputAsciiHexDecodeStream.cpp
# Opt level: O2

void __thiscall InputAsciiHexDecodeStream::ReadNextBuffer(InputAsciiHexDecodeStream *this)

{
  int iVar1;
  Byte aByte;
  Byte buffer [2];
  
  while (iVar1 = (*this->mSourceStream->_vptr_IByteReader[3])(), (char)iVar1 != '\0') {
    (*this->mSourceStream->_vptr_IByteReader[2])(this->mSourceStream,&aByte,1);
  }
  return;
}

Assistant:

void InputAsciiHexDecodeStream::ReadNextBuffer()
{
	Byte buffer[2];
	Byte aByte = 0;
	int readIndex = 0;
	
	while(readIndex < 2 && mSourceStream->NotEnded())
	{
		mSourceStream->Read(&aByte,1);

		if(33 <= aByte && aByte<= 117)
		{
			buffer[readIndex] = aByte;
			++readIndex;
		}
		else if(aByte == 122)
		{
			// z - special case
			buffer[readIndex] = aByte;
			++readIndex;
			break;
		}
		else if(aByte == 126)
		{
			// EOD marker
			mSourceStream->Read(&aByte,1);
			if(aByte == 62)
			{
				mHitEnd = true;
				break;
			}
		}
		// else, continue to next character, skipping space and invalid

	}

	// if there's anything to decode
	if(readIndex > 0)
	{
		if(buffer[0] == 122)
		{
			// special case Z
			mBuffer[0] = mBuffer[1] = mBuffer[2] = mBuffer[3] = 0;
			mReadBufferIndex = 0;
			mReadBufferSize = 4;
		}
		else
		{
			unsigned long encodedValue = 0;

			if (buffer[0] >= '0' && buffer[0] <= '9') {
				encodedValue = (buffer[0] - '0') << 4;
			}
			else if (buffer[0] >= 'A' && buffer[0] <= 'F') {
				encodedValue = (buffer[0] - 'A' + 10) << 4;
			}
			else if (buffer[0] >= 'a' && buffer[0] <= 'f') {
				encodedValue = (buffer[0] - 'a' + 10) << 4;
			}

			if (buffer[1] >= '0' && buffer[1] <= '9') {
				encodedValue += buffer[1] - '0';
			}
			else if (buffer[1] >= 'A' && buffer[1] <= 'F') {
				encodedValue += buffer[1] - 'A' + 10;
			}
			else if (buffer[1] >= 'a' && buffer[1] <= 'f') {
				encodedValue += buffer[1] - 'a' + 10;
			}

			memcpy(mBuffer, &encodedValue,4);
			mReadBufferIndex = 0;
			mReadBufferSize = readIndex-1;
		}

	}
}